

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O1

int hashtable_del(hashtable_t *hashtable,char *key)

{
  json_t *json;
  uint32_t uVar1;
  size_t length;
  pair_t *ptr;
  hashtable_list *phVar2;
  size_t sVar3;
  int iVar4;
  bucket_t *bucket;
  
  length = strlen(key);
  uVar1 = hashlittle(key,length,hashtable_seed);
  iVar4 = -1;
  bucket = hashtable->buckets + (~(-1 << ((byte)hashtable->order & 0x1f)) & uVar1);
  ptr = hashtable_find_pair(hashtable,bucket,key,(ulong)uVar1);
  if (ptr != (pair_t *)0x0) {
    if (ptr == (pair_t *)bucket->first) {
      if (ptr == (pair_t *)bucket->last) {
        phVar2 = &hashtable->list;
        bucket->last = phVar2;
      }
      else {
        phVar2 = (ptr->list).next;
      }
      bucket->first = phVar2;
    }
    else if (ptr == (pair_t *)bucket->last) {
      bucket->last = (ptr->list).prev;
    }
    phVar2 = (ptr->list).prev;
    phVar2->next = (ptr->list).next;
    ((ptr->list).next)->prev = phVar2;
    phVar2 = (ptr->ordered_list).prev;
    phVar2->next = (ptr->ordered_list).next;
    ((ptr->ordered_list).next)->prev = phVar2;
    json = ptr->value;
    if (((json != (json_t *)0x0) && (json->refcount != 0xffffffffffffffff)) &&
       (sVar3 = json->refcount - 1, json->refcount = sVar3, sVar3 == 0)) {
      json_delete(json);
    }
    jsonp_free(ptr);
    hashtable->size = hashtable->size - 1;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int hashtable_del(hashtable_t *hashtable, const char *key)
{
    size_t hash = hash_str(key);
    return hashtable_do_del(hashtable, key, hash);
}